

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureUnitTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::TextureUnitCase::TextureUnitCase
          (TextureUnitCase *this,Context *context,char *name,char *desc,int numUnits,
          CaseType caseType,deUint32 randSeed)

{
  tcu::TestCase::TestCase((TestCase *)this,context->m_testCtx,NODETYPE_SELF_VALIDATE,name,desc);
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TextureUnitCase_00d28130;
  this->m_numUnitsParam = numUnits;
  this->m_caseType = caseType;
  this->m_randSeed = randSeed;
  memset(&this->m_textureTypes,0,200);
  return;
}

Assistant:

TextureUnitCase::TextureUnitCase (Context& context, const char* name, const char* desc, int numUnits, CaseType caseType, deUint32 randSeed)
	: TestCase			(context, tcu::NODETYPE_SELF_VALIDATE, name, desc)
	, m_numUnitsParam	(numUnits)
	, m_caseType		(caseType)
	, m_randSeed		(randSeed)
	, m_shader			(DE_NULL)
{
}